

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmELF.cxx
# Opt level: O2

StringEntry * __thiscall
cmELFInternalImpl<cmELFTypes64>::GetDynamicSectionString
          (cmELFInternalImpl<cmELFTypes64> *this,uint tag)

{
  map<unsigned_int,_cmELF::StringEntry,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_cmELF::StringEntry>_>_>
  *this_00;
  pointer paVar1;
  ulong uVar2;
  basic_istream<char,_std::char_traits<char>_> *pbVar3;
  bool bVar4;
  iterator iVar5;
  mapped_type *pmVar6;
  ulong uVar7;
  long *plVar8;
  pointer paVar9;
  ulong uVar10;
  char *msg;
  long lVar11;
  ulong uVar12;
  char c;
  char local_45;
  uint local_44;
  undefined8 local_40;
  ulong local_38;
  
  this_00 = &(this->super_cmELFInternal).DynamicSectionStrings;
  local_44 = tag;
  iVar5 = std::
          _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_cmELF::StringEntry>,_std::_Select1st<std::pair<const_unsigned_int,_cmELF::StringEntry>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_cmELF::StringEntry>_>_>
          ::find(&this_00->_M_t,&local_44);
  if ((_Rb_tree_header *)iVar5._M_node !=
      &(this->super_cmELFInternal).DynamicSectionStrings._M_t._M_impl.super__Rb_tree_header) {
    if (iVar5._M_node[2]._M_parent == (_Base_ptr)0x0) {
      return (StringEntry *)0x0;
    }
    return (StringEntry *)&iVar5._M_node[1]._M_parent;
  }
  pmVar6 = std::
           map<unsigned_int,_cmELF::StringEntry,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_cmELF::StringEntry>_>_>
           ::operator[](this_00,&local_44);
  pmVar6->Position = 0;
  pmVar6->Size = 0;
  pmVar6->IndexInSection = -1;
  bVar4 = LoadDynamicSection(this);
  if (bVar4) {
    paVar1 = (this->SectionHeaders).super__Vector_base<Elf64_Shdr,_std::allocator<Elf64_Shdr>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar7 = (ulong)paVar1[(this->super_cmELFInternal).DynamicSectionIndex].sh_link;
    if (uVar7 < (ulong)((long)(this->SectionHeaders).
                              super__Vector_base<Elf64_Shdr,_std::allocator<Elf64_Shdr>_>._M_impl.
                              super__Vector_impl_data._M_finish - (long)paVar1 >> 6)) {
      paVar9 = (this->DynamicSectionEntries).
               super__Vector_base<Elf64_Dyn,_std::allocator<Elf64_Dyn>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar11 = -(long)paVar9;
      while( true ) {
        if (paVar9 == (this->DynamicSectionEntries).
                      super__Vector_base<Elf64_Dyn,_std::allocator<Elf64_Dyn>_>._M_impl.
                      super__Vector_impl_data._M_finish) {
          return (StringEntry *)0x0;
        }
        if (paVar9->d_tag == (ulong)local_44) break;
        paVar9 = paVar9 + 1;
        lVar11 = lVar11 + -0x10;
      }
      uVar10 = (paVar9->d_un).d_val;
      uVar2 = paVar1[uVar7].sh_size;
      if (uVar10 < uVar2) {
        local_40 = 0;
        std::istream::seekg((this->super_cmELFInternal).Stream._M_t.
                            super___uniq_ptr_impl<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_false>
                            ._M_head_impl,paVar1[uVar7].sh_offset + uVar10,0);
        local_38 = uVar10;
        while ((uVar12 = uVar2, uVar2 != uVar10 &&
               (plVar8 = (long *)std::istream::get((char *)(this->super_cmELFInternal).Stream._M_t.
                                                                                                                      
                                                  super___uniq_ptr_impl<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                                                  .
                                                  super__Head_base<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_false>
                                                  ._M_head_impl), uVar12 = uVar10,
               (*(byte *)((long)plVar8 + *(long *)(*plVar8 + -0x18) + 0x20) & 5) == 0))) {
          if (((byte)local_40 & local_45 != '\0') != 0) break;
          if (local_45 == '\0') {
            uVar10 = uVar10 + 1;
            local_40 = CONCAT71((int7)((ulong)plVar8 >> 8),1);
          }
          else {
            std::__cxx11::string::push_back((char)pmVar6);
            uVar10 = uVar10 + 1;
          }
        }
        pbVar3 = (this->super_cmELFInternal).Stream._M_t.
                 super___uniq_ptr_impl<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
                 .super__Head_base<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_false>.
                 _M_head_impl;
        if (((&pbVar3->field_0x20)[(long)pbVar3->_vptr_basic_istream[0xfffffffffffffffd]] & 5) != 0)
        {
          cmELFInternal::SetErrorMessage
                    (&this->super_cmELFInternal,"Dynamic section specifies unreadable RPATH.");
          std::__cxx11::string::assign((char *)pmVar6);
          return (StringEntry *)0x0;
        }
        pmVar6->Position = local_38 + paVar1[uVar7].sh_offset;
        pmVar6->Size = uVar12 - local_38;
        pmVar6->IndexInSection =
             (int)((ulong)-((long)&((this->DynamicSectionEntries).
                                    super__Vector_base<Elf64_Dyn,_std::allocator<Elf64_Dyn>_>.
                                    _M_impl.super__Vector_impl_data._M_start)->d_tag + lVar11) >> 4)
        ;
        return pmVar6;
      }
      msg = "Section DYNAMIC references string beyond the end of its string section.";
    }
    else {
      msg = "Section DYNAMIC has invalid string table index.";
    }
    cmELFInternal::SetErrorMessage(&this->super_cmELFInternal,msg);
  }
  return (StringEntry *)0x0;
}

Assistant:

cmELF::StringEntry const* cmELFInternalImpl<Types>::GetDynamicSectionString(
  unsigned int tag)
{
  // Short-circuit if already checked.
  auto dssi = this->DynamicSectionStrings.find(tag);
  if (dssi != this->DynamicSectionStrings.end()) {
    if (dssi->second.Position > 0) {
      return &dssi->second;
    }
    return nullptr;
  }

  // Create an entry for this tag.  Assume it is missing until found.
  StringEntry& se = this->DynamicSectionStrings[tag];
  se.Position = 0;
  se.Size = 0;
  se.IndexInSection = -1;

  // Try reading the dynamic section.
  if (!this->LoadDynamicSection()) {
    return nullptr;
  }

  // Get the string table referenced by the DYNAMIC section.
  ELF_Shdr const& sec = this->SectionHeaders[this->DynamicSectionIndex];
  if (sec.sh_link >= this->SectionHeaders.size()) {
    this->SetErrorMessage("Section DYNAMIC has invalid string table index.");
    return nullptr;
  }
  ELF_Shdr const& strtab = this->SectionHeaders[sec.sh_link];

  // Look for the requested entry.
  for (auto di = this->DynamicSectionEntries.begin();
       di != this->DynamicSectionEntries.end(); ++di) {
    ELF_Dyn& dyn = *di;
    if (static_cast<tagtype>(dyn.d_tag) == static_cast<tagtype>(tag)) {
      // We found the tag requested.
      // Make sure the position given is within the string section.
      if (dyn.d_un.d_val >= strtab.sh_size) {
        this->SetErrorMessage("Section DYNAMIC references string beyond "
                              "the end of its string section.");
        return nullptr;
      }

      // Seek to the position reported by the entry.
      unsigned long first = static_cast<unsigned long>(dyn.d_un.d_val);
      unsigned long last = first;
      unsigned long end = static_cast<unsigned long>(strtab.sh_size);
      this->Stream->seekg(strtab.sh_offset + first);

      // Read the string.  It may be followed by more than one NULL
      // terminator.  Count the total size of the region allocated to
      // the string.  This assumes that the next string in the table
      // is non-empty, but the "chrpath" tool makes the same
      // assumption.
      bool terminated = false;
      char c;
      while (last != end && this->Stream->get(c) && !(terminated && c)) {
        ++last;
        if (c) {
          se.Value += c;
        } else {
          terminated = true;
        }
      }

      // Make sure the whole value was read.
      if (!(*this->Stream)) {
        this->SetErrorMessage("Dynamic section specifies unreadable RPATH.");
        se.Value = "";
        return nullptr;
      }

      // The value has been read successfully.  Report it.
      se.Position = static_cast<unsigned long>(strtab.sh_offset + first);
      se.Size = last - first;
      se.IndexInSection =
        static_cast<int>(di - this->DynamicSectionEntries.begin());
      return &se;
    }
  }
  return nullptr;
}